

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O1

void png_write_rows(png_structrp png_ptr,png_bytepp row,png_uint_32 num_rows)

{
  long lVar1;
  
  if (num_rows != 0 && png_ptr != (png_structrp)0x0) {
    lVar1 = 0;
    do {
      png_write_row(png_ptr,row[lVar1]);
      lVar1 = lVar1 + 1;
    } while (num_rows != (png_uint_32)lVar1);
  }
  return;
}

Assistant:

void PNGAPI
png_write_rows(png_structrp png_ptr, png_bytepp row,
    png_uint_32 num_rows)
{
   png_uint_32 i; /* row counter */
   png_bytepp rp; /* row pointer */

   png_debug(1, "in png_write_rows");

   if (png_ptr == NULL)
      return;

   /* Loop through the rows */
   for (i = 0, rp = row; i < num_rows; i++, rp++)
   {
      png_write_row(png_ptr, *rp);
   }
}